

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O0

string * __thiscall
duckdb::CatalogSearchPath::GetDefaultCatalog(CatalogSearchPath *this,string *schema)

{
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  CatalogSearchEntry *path;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::CatalogSearchEntry,_true> *__range1;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
  *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator *paVar2;
  string *in_stack_ffffffffffffff88;
  string *l1;
  allocator local_51;
  reference local_50;
  string *in_stack_ffffffffffffffb8;
  __normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
  local_40;
  long local_38;
  allocator local_19 [25];
  
  l1 = in_RDI;
  bVar1 = DefaultSchemaGenerator::IsDefaultSchema(in_stack_ffffffffffffffb8);
  if (bVar1) {
    paVar2 = local_19;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)l1,"system",paVar2);
    ::std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else {
    local_38 = in_RSI + 8;
    local_40._M_current =
         (CatalogSearchEntry *)
         ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
         begin(in_stack_ffffffffffffff78);
    ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::end
              (in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      local_50 = __gnu_cxx::
                 __normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
                 ::operator*(&local_40);
      bVar1 = ::std::operator==(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
      if ((!bVar1) && (bVar1 = StringUtil::CIEquals(l1,in_stack_ffffffffffffff88), bVar1)) {
        ::std::__cxx11::string::string((string *)l1,(string *)local_50);
        return in_RDI;
      }
      __gnu_cxx::
      __normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
      ::operator++(&local_40);
    }
    paVar2 = &local_51;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)l1,anon_var_dwarf_3e84037 + 9,paVar2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return in_RDI;
}

Assistant:

string CatalogSearchPath::GetDefaultCatalog(const string &schema) const {
	if (DefaultSchemaGenerator::IsDefaultSchema(schema)) {
		return SYSTEM_CATALOG;
	}
	for (auto &path : paths) {
		if (path.catalog == TEMP_CATALOG) {
			continue;
		}
		if (StringUtil::CIEquals(path.schema, schema)) {
			return path.catalog;
		}
	}
	return INVALID_CATALOG;
}